

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O3

void __thiscall
flatbuffers::go::GoGenerator::GenTableBuilders
          (GoGenerator *this,StructDef *struct_def,string *code_ptr)

{
  BaseType BVar1;
  FieldDef *field;
  pointer ppFVar2;
  pointer ppFVar3;
  
  GetStartOfTable(this,struct_def,code_ptr);
  ppFVar2 = (struct_def->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppFVar3 = ppFVar2;
  if (ppFVar2 !=
      (struct_def->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      field = *ppFVar3;
      if (field->deprecated == false) {
        BuildFieldOfTable(this,struct_def,field,
                          (long)ppFVar2 -
                          (long)(struct_def->fields).vec.
                                super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3,code_ptr);
        BVar1 = (field->value).type.base_type;
        if ((BVar1 == BASE_TYPE_VECTOR64) || (BVar1 == BASE_TYPE_VECTOR)) {
          BuildVectorOfTable(this,struct_def,field,code_ptr);
        }
      }
      ppFVar3 = ppFVar3 + 1;
      ppFVar2 = ppFVar2 + 1;
    } while (ppFVar3 !=
             (struct_def->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  GetEndOffsetOnTable(this,struct_def,code_ptr);
  return;
}

Assistant:

void GenTableBuilders(const StructDef &struct_def, std::string *code_ptr) {
    GetStartOfTable(struct_def, code_ptr);

    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      if (field.deprecated) continue;

      auto offset = it - struct_def.fields.vec.begin();
      BuildFieldOfTable(struct_def, field, offset, code_ptr);
      if (IsVector(field.value.type)) {
        BuildVectorOfTable(struct_def, field, code_ptr);
      }
    }

    GetEndOffsetOnTable(struct_def, code_ptr);
  }